

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<float_const&,bool_const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Quaternion_const&,pbrt::Quaternion_const&,pbrt::SquareMatrix<4>const&,pbrt::SquareMatrix<4>const&,bool_const&>
               (string *s,char *fmt,float *v,bool *args,Vector3<float> *args_1,
               Vector3<float> *args_2,Quaternion *args_3,Quaternion *args_4,SquareMatrix<4> *args_5,
               SquareMatrix<4> *args_6,bool *args_7)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  Vector3<float> *in_RCX;
  Vector3<float> *in_RDX;
  string *unaff_RBX;
  bool *in_RSI;
  string *in_RDI;
  Quaternion *in_R8;
  Quaternion *in_stack_00000010;
  SquareMatrix<4> *in_stack_00000018;
  SquareMatrix<4> *in_stack_00000020;
  bool *in_stack_00000028;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd70;
  char **in_stack_fffffffffffffd78;
  char **in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  string local_268 [32];
  undefined8 local_248;
  string local_240 [32];
  stringstream local_220 [8];
  char *in_stack_fffffffffffffde8;
  undefined1 local_210 [4];
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  LogLevel in_stack_fffffffffffffe04;
  float in_stack_fffffffffffffe4c;
  string local_98 [53];
  byte local_63;
  byte local_62;
  byte local_61;
  string local_60 [40];
  
  copyToFormatString(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  lVar2 = std::__cxx11::string::find((char)local_60,0x2a);
  local_61 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_60,0x73);
  local_62 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_60,100);
  local_63 = lVar2 != -1;
  if ((local_61 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
             in_stack_fffffffffffffde8);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48), bVar1)) {
    FloatToString_abi_cxx11_(in_stack_fffffffffffffe4c);
    std::__cxx11::string::operator+=(in_RDI,local_98);
    std::__cxx11::string::~string(local_98);
  }
  else {
    if ((local_63 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffde8);
    }
    if ((local_62 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                 in_stack_fffffffffffffde8);
      }
      std::__cxx11::string::c_str();
      formatOne<float_const&>(in_stack_fffffffffffffd88,(float *)in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd78);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_220);
      std::ostream::operator<<(local_210,(in_RDX->super_Tuple3<pbrt::Vector3,_float>).x);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_248 = std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,local_240);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::stringstream::~stringstream(local_220);
    }
  }
  stringPrintfRecursive<bool_const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Quaternion_const&,pbrt::Quaternion_const&,pbrt::SquareMatrix<4>const&,pbrt::SquareMatrix<4>const&,bool_const&>
            (unaff_RBX,(char *)in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_stack_00000010,in_stack_00000018
             ,in_stack_00000020,in_stack_00000028);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}